

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::SingleArena_CopyConstructLong_Test::TestBody
          (SingleArena_CopyConstructLong_Test *this)

{
  char *message;
  string_view value;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  ArenaStringPtr field;
  ArenaStringPtr dst;
  string empty;
  SingleArena local_68;
  TaggedStringPtr local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  ArenaStringPtr local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  SingleArena::GetArena(&local_68);
  local_50.ptr_ = &local_30;
  value._M_str = "A string long enough to not be inlined";
  value._M_len = 0x26;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&local_50,value,(Arena *)0x0);
  local_38.tagged_ptr_.ptr_ = (TaggedStringPtr)(TaggedStringPtr)local_50.ptr_;
  if (((ulong)local_50.ptr_ & 3) != 0) {
    local_38.tagged_ptr_ =
         protobuf::internal::TaggedStringPtr::ForceCopy
                   (&local_50,(Arena *)local_68.super_TestWithParam<bool>.super_Test._vptr_Test);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[39]>
            (local_48,"dst.Get()","\"A string long enough to not be inlined\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_38.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
             (char (*) [39])"A string long enough to not be inlined");
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)&local_68.super_TestWithParam<bool>.super_WithParamInterface<bool>);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68.super_TestWithParam<bool>.super_Test.gtest_flag_saver_,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xca,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_68.super_TestWithParam<bool>.super_Test.gtest_flag_saver_,
               (Message *)&local_68.super_TestWithParam<bool>.super_WithParamInterface<bool>);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&local_68.super_TestWithParam<bool>.super_Test.gtest_flag_saver_);
    if (local_68.super_TestWithParam<bool>.super_WithParamInterface<bool>._vptr_WithParamInterface
        != (_func_int **)0x0) {
      (**(code **)(*local_68.super_TestWithParam<bool>.super_WithParamInterface<bool>.
                    _vptr_WithParamInterface + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if ((Arena *)local_68.super_TestWithParam<bool>.super_Test._vptr_Test == (Arena *)0x0) {
    protobuf::internal::ArenaStringPtr::Destroy(&local_38);
  }
  protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_50);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              &local_68);
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructLong) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("A string long enough to not be inlined", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "A string long enough to not be inlined");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}